

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to4_int8.h
# Opt level: O2

void ncnn::convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  void *pvVar1;
  uint uVar2;
  ulong uVar3;
  int k;
  ulong uVar4;
  ulong uVar5;
  int j;
  long lVar6;
  int i;
  uint uVar7;
  long lVar8;
  void *local_e8;
  Mat local_c0;
  Mat kernel;
  
  uVar2 = kernel_w * kernel_h;
  uVar5 = 0;
  Mat::reshape(&kernel,_kernel,uVar2,inch,outch,(Allocator *)0x0);
  Mat::create(kernel_tm,uVar2 * 0x20,inch / 8,outch / 4,1,(Allocator *)0x0);
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar5;
  }
  while (uVar2 = (uint)uVar5, (int)(uVar2 | 3) < outch) {
    Mat::channel(&local_c0,kernel_tm,(int)(uVar5 >> 2));
    local_e8 = local_c0.data;
    Mat::~Mat(&local_c0);
    for (uVar5 = 0; (long)(uVar5 | 7) < (long)inch; uVar5 = uVar5 + 8) {
      for (uVar4 = 0; uVar4 != uVar3; uVar4 = uVar4 + 1) {
        for (uVar7 = 0; uVar7 != 4; uVar7 = uVar7 + 1) {
          for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
            Mat::channel(&local_c0,&kernel,uVar7 | uVar2);
            pvVar1 = local_c0.data;
            lVar8 = (long)local_c0.w * (uVar5 + lVar6) * local_c0.elemsize;
            Mat::~Mat(&local_c0);
            *(undefined1 *)((long)local_e8 + lVar6) = *(undefined1 *)((long)pvVar1 + uVar4 + lVar8);
          }
          local_e8 = (void *)((long)local_e8 + 8);
        }
      }
    }
    uVar5 = (ulong)(uVar2 + 4);
  }
  Mat::~Mat(&kernel);
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 8a-4b-maxk-inch/8a-outch/4b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(32 * maxk, inch / 8, outch / 4, (size_t)1u);

    for (int q = 0; q + 3 < outch; q += 4)
    {
        signed char* g00 = kernel_tm.channel(q / 4);

        for (int p = 0; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 4; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const signed char* k00 = kernel.channel(q + i).row<const signed char>(p + j);

                        g00[0] = k00[k];

                        g00++;
                    }
                }
            }
        }
    }
}